

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *__return_storage_ptr__;
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  pointer linkLineComputer_00;
  cmStateDirectory *local_260;
  string local_200;
  cmStateSnapshot local_1e0;
  cmStateDirectory local_1c8;
  undefined1 local_1a0 [8];
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  string extraFlags;
  cmAlphaNum local_100;
  undefined1 local_d0 [8];
  string linkRuleVar;
  undefined1 local_90 [8];
  string linkLanguage;
  string local_68;
  string local_38;
  undefined1 local_12;
  byte local_11;
  bool requiresDeviceLinking;
  cmMakefileLibraryTargetGenerator *pcStack_10;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  local_11 = relink;
  pcStack_10 = this;
  if (!relink) {
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              (&local_38,&this->super_cmMakefileTargetGenerator);
    bVar3 = requireDeviceLinking(pcVar1,(cmLocalGenerator *)pcVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    local_12 = bVar3;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
                 (allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
      WriteDeviceLibraryRules(this,&local_68,(bool)(local_11 & 1));
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf))
      ;
    }
  }
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  __return_storage_ptr__ = (string *)((long)&linkRuleVar.field_2 + 8);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (__return_storage_ptr__,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_90,pcVar1,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  cmAlphaNum::cmAlphaNum(&local_100,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&extraFlags.field_2 + 8),(string *)local_90);
  cmStrCat<char[22]>((string *)local_d0,&local_100,(cmAlphaNum *)((long)&extraFlags.field_2 + 8),
                     (char (*) [22])"_CREATE_SHARED_MODULE");
  std::__cxx11::string::string((string *)local_150);
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_150,(string *)local_90);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CMAKE_MODULE_LINKER_FLAGS",&local_171);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&linkLineComputer,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar2,(string *)local_150,&local_170,(string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_260 = (cmStateDirectory *)0x0;
  if (pcVar2 != (cmLocalUnixMakefileGenerator3 *)0x0) {
    local_260 = (cmStateDirectory *)
                &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
  }
  cmLocalGenerator::GetStateSnapshot
            (&local_1e0,(cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmStateSnapshot::GetDirectory(&local_1c8,&local_1e0);
  cmMakefileTargetGenerator::CreateLinkLineComputer
            ((cmMakefileTargetGenerator *)local_1a0,(cmOutputConverter *)this,local_260);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  linkLineComputer_00 =
       std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                 ((unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> *)
                  local_1a0);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_200,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AppendModuleDefinitionFlag
            ((cmLocalGenerator *)pcVar2,(string *)local_150,pcVar1,linkLineComputer_00,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  WriteLibraryRules(this,(string *)local_d0,(string *)local_150,(bool)(local_11 & 1));
  std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
            ((unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> *)local_1a0);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{
  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
    if (requiresDeviceLinking) {
      this->WriteDeviceLibraryRules("CMAKE_CUDA_DEVICE_LINK_LIBRARY", relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_SHARED_MODULE");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->GetConfigName());

  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory());

  this->LocalGenerator->AppendModuleDefinitionFlag(
    extraFlags, this->GeneratorTarget, linkLineComputer.get(),
    this->GetConfigName());

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}